

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_pages_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::testPages(FuzzHelper *this)

{
  undefined8 uVar1;
  QPDFObjGen og;
  long lVar2;
  pointer this_00;
  size_type sVar3;
  QPDFObjectHandle page_obj;
  shared_ptr<QPDF> q;
  DiscardContents discard_contents;
  QPDFAcroFormDocumentHelper afdh;
  QPDFPageDocumentHelper pdh;
  QPDFOutlineDocumentHelper odh;
  QPDFPageLabelDocumentHelper pldh;
  BaseHandle local_248;
  long local_238;
  undefined1 local_230 [56];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_1f8;
  JSON local_1e0;
  QPDFAcroFormDocumentHelper local_1d0;
  QPDFAnnotationObjectHelper local_1b0;
  QPDFPageObjectHelper local_178;
  QPDFPageDocumentHelper local_140;
  string local_120;
  undefined1 local_100 [48];
  QPDFPageLabelDocumentHelper local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_b0;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_80;
  QPDFFormFieldObjectHelper local_68;
  
  getQpdf((FuzzHelper *)local_230);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_140,(QPDF *)local_230._0_8_);
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&local_d0,(QPDF *)local_230._0_8_);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)(local_100 + 0x10),(QPDF *)local_230._0_8_);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_1d0,(QPDF *)local_230._0_8_);
  QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded(&local_1d0);
  QPDFPageDocumentHelper::flattenAnnotations(&local_140,0,3);
  local_230._24_8_ = &PTR__ParserCallbacks_002eab18;
  QPDFPageDocumentHelper::getAllPages(&local_1f8,&local_140);
  local_230._16_8_ =
       local_1f8.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (local_1f8.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar2 = 0;
    this_00 = local_1f8.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      QPDFPageObjectHelper::coalesceContentStreams(this_00);
      QPDFPageObjectHelper::parseContents(this_00,(ParserCallbacks *)(local_230 + 0x18));
      QPDFPageObjectHelper::getImages_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)&local_b0,this_00);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&local_b0);
      QPDFPageLabelDocumentHelper::getLabelForPage
                ((QPDFPageLabelDocumentHelper *)local_100,(longlong)&local_d0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      local_238 = lVar2 + 1;
      QPDFObjectHandle::getJSON((QPDFObjectHandle *)&local_1e0,(int)&local_248,true);
      JSON::unparse_abi_cxx11_(&local_120,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_248);
      QPDFOutlineDocumentHelper::getOutlinesForPage
                (&local_80,(QPDFOutlineDocumentHelper *)(local_100 + 0x10),og);
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                (&local_80);
      local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this_00->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this_00->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_178.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFPageObjectHelper_002eab70;
      local_178.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this_00->m).
               super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_178.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this_00->m).
           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_178.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_178.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_178.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_178.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_178.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 (local_230 + 0x20),&local_1d0,&local_178);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_178);
      uVar1 = local_230._40_8_;
      for (sVar3 = local_230._32_8_; sVar3 != uVar1; sVar3 = sVar3 + 0x38) {
        local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(sVar3 + 8);
        local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar3 + 0x10);
        if (local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_1b0.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(sVar3 + 0x18);
        local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar3 + 0x20);
        if (local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_1b0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        local_1b0.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)&PTR__QPDFAnnotationObjectHelper_002eaba8;
        local_1b0.m.
        super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(sVar3 + 0x28);
        local_1b0.m.
        super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar3 + 0x30);
        if (local_1b0.m.
            super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1b0.m.
             super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1b0.m.
                  super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1b0.m.
             super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1b0.m.
                  super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        QPDFAcroFormDocumentHelper::getFieldForAnnotation(&local_68,&local_1d0,&local_1b0);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_1b0);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 (local_230 + 0x20));
      if (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this_00 = this_00 + 1;
      lVar2 = local_238;
    } while (this_00 != (pointer)local_230._16_8_);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_1f8);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_1d0);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)(local_100 + 0x10));
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&local_d0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_140);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
  }
  return;
}

Assistant:

void
FuzzHelper::testPages()
{
    // Parse all content streams, and exercise some helpers that
    // operate on pages.
    std::shared_ptr<QPDF> q = getQpdf();
    QPDFPageDocumentHelper pdh(*q);
    QPDFPageLabelDocumentHelper pldh(*q);
    QPDFOutlineDocumentHelper odh(*q);
    QPDFAcroFormDocumentHelper afdh(*q);
    afdh.generateAppearancesIfNeeded();
    pdh.flattenAnnotations();
    DiscardContents discard_contents;
    int pageno = 0;
    for (auto& page: pdh.getAllPages()) {
        ++pageno;
        try {
            page.coalesceContentStreams();
            page.parseContents(&discard_contents);
            page.getImages();
            pldh.getLabelForPage(pageno);
            QPDFObjectHandle page_obj(page.getObjectHandle());
            page_obj.getJSON(JSON::LATEST, true).unparse();
            odh.getOutlinesForPage(page_obj);

            for (auto& aoh: afdh.getWidgetAnnotationsForPage(page)) {
                afdh.getFieldForAnnotation(aoh);
            }
        } catch (QPDFExc& e) {
            std::cerr << "page " << pageno << ": " << e.what() << '\n';
        }
    }
}